

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double erf1(double *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *x;
  dVar2 = ABS(dVar1);
  if (dVar2 <= 0.5) {
    dVar2 = dVar1 * dVar1;
    erf1::top = (((dVar2 * 7.7105849500132e-05 + -0.00133733772997339) * dVar2 + 0.0323076579225834)
                 * dVar2 + 0.0479137145607681) * dVar2 + 0.128379167095513 + 1.0;
    erf1::bot = ((dVar2 * 0.00301048631703895 + 0.0538971687740286) * dVar2 + 0.375795757275549) *
                dVar2 + 1.0;
    erf1::erf1 = (erf1::top / erf1::bot) * dVar1;
  }
  else {
    if (dVar2 <= 4.0) {
      erf1::top = ((((((dVar2 * -1.36864857382717e-07 + 0.564195517478974) * dVar2 +
                      7.21175825088309) * dVar2 + 43.1622272220567) * dVar2 + 152.98928504694) *
                    dVar2 + 339.320816734344) * dVar2 + 451.918953711873) * dVar2 + 300.459261020162
      ;
      erf1::bot = ((((((dVar2 + 12.7827273196294) * dVar2 + 77.0001529352295) * dVar2 +
                     277.585444743988) * dVar2 + 638.980264465631) * dVar2 + 931.35409485061) *
                   dVar2 + 790.950925327898) * dVar2 + 300.459260956983;
      dVar1 = exp(-dVar1 * dVar1);
      dVar1 = (dVar1 * erf1::top) / erf1::bot;
    }
    else {
      if (5.8 <= dVar2) {
        erf1::erf1 = *(double *)(&DAT_00113e50 + (ulong)(dVar1 < 0.0) * 8);
        return *(double *)(&DAT_00113e50 + (ulong)(dVar1 < 0.0) * 8);
      }
      dVar1 = dVar1 * dVar1;
      dVar3 = 1.0 / dVar1;
      erf1::top = (((dVar3 * 2.10144126479064 + 26.2370141675169) * dVar3 + 21.3688200555087) *
                   dVar3 + 4.6580782871847) * dVar3 + 0.282094791773523;
      erf1::bot = (((dVar3 * 94.153775055546 + 187.11481179959) * dVar3 + 99.0191814623914) * dVar3
                  + 18.0124575948747) * dVar3 + 1.0;
      erf1::erf1 = (0.564189583547756 - erf1::top / (erf1::bot * dVar1)) / dVar2;
      dVar1 = exp(-dVar1);
      dVar1 = dVar1 * erf1::erf1;
    }
    erf1::erf1 = (0.5 - dVar1) + 0.5;
    if (*x <= 0.0 && *x != 0.0) {
      erf1::erf1 = -erf1::erf1;
    }
  }
  return erf1::erf1;
}

Assistant:

double erf1(double *x)
/*
-----------------------------------------------------------------------
             EVALUATION OF THE REAL ERROR FUNCTION
-----------------------------------------------------------------------
*/
{
static double c = .564189583547756e0;
static double a[5] = {
    .771058495001320e-04,-.133733772997339e-02,.323076579225834e-01,
    .479137145607681e-01,.128379167095513e+00
};
static double b[3] = {
    .301048631703895e-02,.538971687740286e-01,.375795757275549e+00
};
static double p[8] = {
    -1.36864857382717e-07,5.64195517478974e-01,7.21175825088309e+00,
    4.31622272220567e+01,1.52989285046940e+02,3.39320816734344e+02,
    4.51918953711873e+02,3.00459261020162e+02
};
static double q[8] = {
    1.00000000000000e+00,1.27827273196294e+01,7.70001529352295e+01,
    2.77585444743988e+02,6.38980264465631e+02,9.31354094850610e+02,
    7.90950925327898e+02,3.00459260956983e+02
};
static double r[5] = {
    2.10144126479064e+00,2.62370141675169e+01,2.13688200555087e+01,
    4.65807828718470e+00,2.82094791773523e-01
};
static double s[4] = {
    9.41537750555460e+01,1.87114811799590e+02,9.90191814623914e+01,
    1.80124575948747e+01
};
static double erf1,ax,bot,t,top,x2;
/*
     ..
     .. Executable Statements ..
*/
    ax = fabs(*x);
    if(ax > 0.5e0) goto S10;
    t = *x**x;
    top = (((a[0]*t+a[1])*t+a[2])*t+a[3])*t+a[4]+1.0e0;
    bot = ((b[0]*t+b[1])*t+b[2])*t+1.0e0;
    erf1 = *x*(top/bot);
    return erf1;
S10:
    if(ax > 4.0e0) goto S20;
    top = ((((((p[0]*ax+p[1])*ax+p[2])*ax+p[3])*ax+p[4])*ax+p[5])*ax+p[6])*ax+p[
      7];
    bot = ((((((q[0]*ax+q[1])*ax+q[2])*ax+q[3])*ax+q[4])*ax+q[5])*ax+q[6])*ax+q[
      7];
    erf1 = 0.5e0+(0.5e0-exp(-(*x**x))*top/bot);
    if(*x < 0.0e0) erf1 = -erf1;
    return erf1;
S20:
    if(ax >= 5.8e0) goto S30;
    x2 = *x**x;
    t = 1.0e0/x2;
    top = (((r[0]*t+r[1])*t+r[2])*t+r[3])*t+r[4];
    bot = (((s[0]*t+s[1])*t+s[2])*t+s[3])*t+1.0e0;
    erf1 = (c-top/(x2*bot))/ax;
    erf1 = 0.5e0+(0.5e0-exp(-x2)*erf1);
    if(*x < 0.0e0) erf1 = -erf1;
    return erf1;
S30:
    erf1 = fifdsign(1.0e0,*x);
    return erf1;
}